

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rawdata_create.c
# Opt level: O0

int rd_dimensions(mpt_rawdata *ptr,int part)

{
  _mpt_vptr_rawdata *p_Var1;
  int max;
  mpt_rawdata_stage *st;
  mpt_buffer *buf;
  mpt_RawData *rd;
  int part_local;
  mpt_rawdata *ptr_local;
  
  p_Var1 = ptr[2]._vptr;
  if (p_Var1 == (_mpt_vptr_rawdata *)0x0) {
    ptr_local._4_4_ = -4;
  }
  else {
    rd._4_4_ = part;
    if (part < 0) {
      rd._4_4_ = (int)ptr[3]._vptr;
    }
    if (rd._4_4_ < (int)((ulong)p_Var1->dimension_count >> 4)) {
      if ((&p_Var1->stage_count)[(long)rd._4_4_ * 2] == (_func_int_mpt_rawdata_ptr *)0x0) {
        ptr_local._4_4_ = 0;
      }
      else {
        ptr_local._4_4_ = (int)(*(ulong *)((&p_Var1->stage_count)[(long)rd._4_4_ * 2] + 0x18) >> 4);
      }
    }
    else {
      ptr_local._4_4_ = -2;
    }
  }
  return ptr_local._4_4_;
}

Assistant:

static int rd_dimensions(const MPT_INTERFACE(rawdata) *ptr, int part)
{
	const MPT_STRUCT(RawData) *rd = MPT_baseaddr(RawData, ptr, _rd);
	const MPT_STRUCT(buffer) *buf;
	const MPT_STRUCT(rawdata_stage) *st;
	int max;
	
	if (!(buf = rd->st._buf)) {
		return MPT_ERROR(BadOperation);
	}
	st = (void *) (buf + 1);
	max = buf->_used / sizeof(*st);
	
	if (part < 0) {
		part = rd->act;
	}
	if (part >= max) {
		return MPT_ERROR(BadValue);
	}
	if (!(buf = st[part]._d._buf)) {
		return 0;
	}
	return buf->_used / sizeof(MPT_STRUCT(value_store));
}